

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::FloatVector::SerializeWithCachedSizes
          (FloatVector *this,CodedOutputStream *output)

{
  Rep *pRVar1;
  float *a;
  
  if (0 < (this->vector_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_vector_cached_byte_size_);
    pRVar1 = (this->vector_).rep_;
    a = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      a = (float *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteFloatArray
              (a,(this->vector_).current_size_,output);
    return;
  }
  return;
}

Assistant:

void FloatVector::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.FloatVector)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float vector = 1;
  if (this->vector_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_vector_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->vector().data(), this->vector_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.FloatVector)
}